

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O0

Expression __thiscall
cnn::SimpleRNNBuilder::add_auxiliary_input(SimpleRNNBuilder *this,Expression *in,Expression *aux)

{
  size_type sVar1;
  reference pvVar2;
  undefined8 extraout_RDX;
  long in_RSI;
  ComputationGraph *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double __x;
  Expression EVar3;
  Expression y;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *vars;
  uint i;
  Expression x;
  uint t;
  initializer_list<cnn::expr::Expression> *in_stack_fffffffffffffe08;
  Expression *in_stack_fffffffffffffe10;
  allocator_type *in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_fffffffffffffe30;
  expr local_198 [16];
  undefined1 local_188 [16];
  initializer_list<cnn::expr::Expression> iStack_178;
  Expression EStack_168;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_138 [48];
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_e8 [80];
  undefined1 *local_98;
  undefined8 local_90;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *local_78;
  uint local_6c;
  uint local_24;
  
  sVar1 = std::
          vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ::size((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                  *)(in_RSI + 0x58));
  local_24 = (uint)sVar1;
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x6570eb);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::push_back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               *)in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffe20);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x657132);
  cnn::expr::Expression::Expression
            (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
  local_6c = 0;
  while( true ) {
    if (*(uint *)(in_RSI + 0x88) <= local_6c) {
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    *)(in_RSI + 0x58),(ulong)local_24);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::back
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 in_stack_fffffffffffffe10);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
      EVar3._8_8_ = extraout_RDX;
      EVar3.pg = in_RDI;
      return EVar3;
    }
    local_78 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                             *)(in_RSI + 0x40),(ulong)local_6c);
    sVar1 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                      (local_78);
    if (sVar1 < 4) break;
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (local_78,2);
    cnn::expr::Expression::Expression
              (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (local_78,0);
    cnn::expr::Expression::Expression
              (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
    cnn::expr::Expression::Expression
              (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (local_78,3);
    cnn::expr::Expression::Expression
              (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
    cnn::expr::Expression::Expression
              (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
    local_98 = local_e8;
    local_90 = 5;
    cnn::expr::affine_transform(in_stack_fffffffffffffe08);
    __x = extraout_XMM0_Qa;
    if ((local_24 == 0) &&
       (sVar1 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size
                          ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                           (in_RSI + 0x70)), __x = extraout_XMM0_Qa_00, sVar1 != 0)) {
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_78,1);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 (in_RSI + 0x70),(ulong)local_6c);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
      local_108 = local_138;
      local_100 = 3;
      cnn::expr::affine_transform(in_stack_fffffffffffffe08);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
      __x = extraout_XMM0_Qa_01;
    }
    else if (local_24 != 0) {
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe08 = &iStack_178;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_78,1);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe10 = &EStack_168;
      pvVar2 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                             *)(in_RSI + 0x58),(ulong)(local_24 - 1));
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar2,(ulong)local_6c);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
      local_158 = local_188;
      local_150 = 3;
      cnn::expr::affine_transform(in_stack_fffffffffffffe08);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
      __x = extraout_XMM0_Qa_02;
    }
    cnn::expr::tanh(local_198,__x);
    pvVar2 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                           *)(in_RSI + 0x58),(ulong)local_24);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (pvVar2,(ulong)local_6c);
    cnn::expr::Expression::operator=
              (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
    cnn::expr::Expression::operator=
              (in_stack_fffffffffffffe10,(Expression *)in_stack_fffffffffffffe08);
    local_6c = local_6c + 1;
  }
  __assert_fail("vars.size() >= L2H + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/rnn.cc"
                ,0x62,
                "Expression cnn::SimpleRNNBuilder::add_auxiliary_input(const Expression &, const Expression &)"
               );
}

Assistant:

Expression SimpleRNNBuilder::add_auxiliary_input(const Expression &in, const Expression &aux) {
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));

  Expression x = in;

  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    assert(vars.size() >= L2H + 1);

    Expression y = affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux});

    if (t == 0 && h0.size() > 0)
      y = affine_transform({y, vars[H2H], h0[i]});
    else if (t >= 1)
      y = affine_transform({y, vars[H2H], h[t-1][i]});

    x = h[t][i] = tanh(y);
  }
  return h[t].back();
}